

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O2

int aom_wiener_denoise_2d
              (uint8_t **data,uint8_t **denoised,int w,int h,int *stride,int *chroma_sub,
              float **noise_psd,int block_size,int bit_depth,int use_highbd)

{
  size_t size;
  int iVar1;
  int iVar2;
  float *a;
  int j;
  uint uVar3;
  uint h_00;
  uint uVar4;
  void *memblk;
  float *b;
  float *b_00;
  double *block;
  double *plane;
  float *memblk_00;
  aom_noise_tx_t *noise_tx;
  float *memblk_01;
  aom_noise_tx_t *noise_tx_00;
  ulong uVar5;
  aom_noise_tx_t *paVar6;
  ulong uVar7;
  int iVar8;
  float *pfVar9;
  int iVar10;
  float *pfVar11;
  uint8_t *puVar12;
  byte bVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  uint n;
  int iVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  float *pfVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  ulong local_1b0;
  long local_150;
  long local_110;
  aom_flat_block_finder_t *local_f8;
  aom_flat_block_finder_t block_finder_chroma;
  aom_flat_block_finder_t block_finder_full;
  
  iVar2 = (w + block_size + -1) / block_size;
  iVar1 = (h + block_size + -1) / block_size;
  if (*chroma_sub == chroma_sub[1]) {
    uVar30 = (iVar2 + 2) * block_size;
    iVar14 = (iVar1 + 2) * block_size;
    uVar3 = aom_flat_block_finder_init(&block_finder_full,block_size,bit_depth,use_highbd);
    memblk = aom_malloc((long)(int)(iVar14 * uVar30) << 2);
    uVar31 = block_size * block_size;
    b = (float *)aom_malloc((ulong)uVar31 * 4);
    b_00 = (float *)aom_memalign(0x20,(long)(int)(uVar31 * 2) << 2);
    size = (ulong)uVar31 * 8;
    block = (double *)aom_malloc(size);
    plane = (double *)aom_malloc(size);
    memblk_00 = get_half_cos_window(block_size);
    noise_tx = aom_noise_tx_malloc(block_size);
    noise_tx_00 = noise_tx;
    memblk_01 = memblk_00;
    if (*chroma_sub != 0) {
      uVar31 = aom_flat_block_finder_init
                         (&block_finder_chroma,block_size >> ((byte)*chroma_sub & 0x1f),bit_depth,
                          use_highbd);
      uVar3 = uVar3 & uVar31;
      memblk_01 = get_half_cos_window(block_size >> ((byte)*chroma_sub & 0x1f));
      noise_tx_00 = aom_noise_tx_malloc(block_size >> ((byte)*chroma_sub & 0x1f));
    }
    fVar43 = (float)~(-1 << ((byte)bit_depth & 0x1f));
    auVar39._0_4_ = -(uint)((int)memblk_00 == 0);
    auVar39._4_4_ = -(uint)((int)((ulong)memblk_00 >> 0x20) == 0);
    auVar39._8_4_ = -(uint)((int)memblk_01 == 0);
    auVar39._12_4_ = -(uint)((int)((ulong)memblk_01 >> 0x20) == 0);
    auVar42._4_4_ = auVar39._0_4_;
    auVar42._0_4_ = auVar39._4_4_;
    auVar42._8_4_ = auVar39._12_4_;
    auVar42._12_4_ = auVar39._8_4_;
    auVar41._0_4_ = -(uint)((int)b_00 == 0);
    auVar41._4_4_ = -(uint)((int)((ulong)b_00 >> 0x20) == 0);
    auVar41._8_4_ = -(uint)((int)block == 0);
    auVar41._12_4_ = -(uint)((int)((ulong)block >> 0x20) == 0);
    auVar40._4_4_ = auVar41._0_4_;
    auVar40._0_4_ = auVar41._4_4_;
    auVar40._8_4_ = auVar41._12_4_;
    auVar40._12_4_ = auVar41._8_4_;
    auVar41 = packssdw(auVar40 & auVar41,auVar42 & auVar39);
    auVar37._0_4_ = -(uint)((int)b == 0);
    auVar37._4_4_ = -(uint)((int)((ulong)b >> 0x20) == 0);
    auVar37._8_4_ = -(uint)((int)plane == 0);
    auVar37._12_4_ = -(uint)((int)((ulong)plane >> 0x20) == 0);
    auVar38._4_4_ = auVar37._0_4_;
    auVar38._0_4_ = auVar37._4_4_;
    auVar38._8_4_ = auVar37._12_4_;
    auVar38._12_4_ = auVar37._8_4_;
    auVar36._0_4_ = -(uint)((int)noise_tx == 0);
    auVar36._4_4_ = -(uint)((int)((ulong)noise_tx >> 0x20) == 0);
    auVar36._8_4_ = -(uint)((int)noise_tx_00 == 0);
    auVar36._12_4_ = -(uint)((int)((ulong)noise_tx_00 >> 0x20) == 0);
    auVar35._4_4_ = auVar36._0_4_;
    auVar35._0_4_ = auVar36._4_4_;
    auVar35._8_4_ = auVar36._12_4_;
    auVar35._12_4_ = auVar36._8_4_;
    auVar36 = packssdw(auVar35 & auVar36,auVar38 & auVar37);
    auVar36 = packssdw(auVar36,auVar41);
    if (memblk == (void *)0x0) {
      uVar3 = 0;
    }
    if ((((((((auVar36 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar36 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar36 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar36 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar36[0xf] < '\0')
    {
      uVar3 = 0;
    }
    uVar5 = (ulong)uVar30;
    for (lVar29 = (ulong)(uVar3 == 0) * 3; lVar29 != 3; lVar29 = lVar29 + 1) {
      paVar6 = noise_tx;
      if (lVar29 == 0) {
        iVar8 = 0;
        bVar13 = 0;
        a = memblk_00;
      }
      else {
        iVar8 = *chroma_sub;
        bVar13 = (byte)chroma_sub[1];
        a = memblk_01;
        if (0 < iVar8) {
          paVar6 = noise_tx_00;
        }
      }
      if ((data[lVar29] != (uint8_t *)0x0) && (denoised[lVar29] != (uint8_t *)0x0)) {
        local_f8 = &block_finder_full;
        if ((lVar29 != 0) && (local_f8 = &block_finder_chroma, *chroma_sub == 0)) {
          local_f8 = &block_finder_full;
        }
        local_110 = 0;
        memset(memblk,0,(long)iVar14 * (long)(int)uVar30 * 4);
        uVar17 = block_size >> (bVar13 & 0x1f);
        uVar25 = block_size >> ((byte)iVar8 & 0x1f);
        uVar31 = w >> ((byte)iVar8 & 0x1f);
        h_00 = h >> (bVar13 & 0x1f);
        n = uVar17 * uVar25;
        uVar32 = 0;
        if (0 < (int)n) {
          uVar32 = (ulong)n;
        }
        uVar16 = 0;
        if (0 < (int)uVar25) {
          uVar16 = (ulong)uVar25;
        }
        uVar15 = 0;
        if (0 < (int)uVar17) {
          uVar15 = (ulong)uVar17;
        }
        uVar4 = uVar30 * uVar17;
        for (iVar8 = 0; iVar8 < (int)uVar17; iVar8 = iVar8 + (int)uVar17 / 2) {
          lVar20 = local_110;
          for (iVar10 = 0; iVar10 < (int)uVar25; iVar10 = iVar10 + (int)((long)(int)uVar25 / 2)) {
            iVar18 = -1;
            local_150 = lVar20;
            while (iVar18 < iVar1) {
              iVar21 = iVar18 * uVar17;
              iVar18 = iVar18 + 1;
              iVar23 = -1;
              lVar27 = local_150;
              while (iVar23 < iVar2) {
                aom_flat_block_finder_extract_block
                          (local_f8,data[lVar29],uVar31,h_00,stride[lVar29],iVar23 * uVar25 + iVar10
                           ,iVar21 + iVar8,plane,block);
                for (uVar7 = 0; uVar32 != uVar7; uVar7 = uVar7 + 1) {
                  b_00[uVar7] = (float)block[uVar7];
                  b[uVar7] = (float)plane[uVar7];
                }
                pointwise_multiply(a,b_00,n);
                aom_noise_tx_forward(paVar6,b_00);
                aom_noise_tx_filter(paVar6,noise_psd[lVar29]);
                aom_noise_tx_inverse(paVar6,b_00);
                pointwise_multiply(a,b,n);
                iVar23 = iVar23 + 1;
                pfVar9 = b;
                pfVar11 = b_00;
                lVar19 = lVar27;
                pfVar28 = a;
                for (uVar7 = 0; uVar7 != uVar15; uVar7 = uVar7 + 1) {
                  for (uVar22 = 0; uVar16 != uVar22; uVar22 = uVar22 + 1) {
                    lVar24 = (long)((int)lVar19 + (int)uVar22);
                    *(float *)((long)memblk + lVar24 * 4) =
                         (pfVar11[uVar22] + pfVar9[uVar22]) * pfVar28[uVar22] +
                         *(float *)((long)memblk + lVar24 * 4);
                  }
                  lVar19 = lVar19 + uVar5;
                  pfVar11 = pfVar11 + (int)uVar25;
                  pfVar9 = pfVar9 + (int)uVar25;
                  pfVar28 = pfVar28 + (int)uVar25;
                }
                lVar27 = lVar27 + (ulong)uVar25;
              }
              local_150 = local_150 + (ulong)uVar4;
            }
            lVar20 = lVar20 + ((long)(int)uVar25 / 2 & 0xffffffffU);
          }
          local_110 = local_110 + (ulong)(uVar30 * ((int)uVar17 / 2));
        }
        uVar32 = 0;
        if (0 < (int)uVar31) {
          uVar32 = (ulong)uVar31;
        }
        uVar16 = 0;
        if (0 < (int)h_00) {
          uVar16 = (ulong)h_00;
        }
        puVar12 = denoised[lVar29];
        iVar8 = stride[lVar29];
        lVar20 = (long)(int)uVar31;
        if (use_highbd == 0) {
          uVar7 = (ulong)((uVar17 + 1) * uVar30 + uVar25);
          local_1b0 = (ulong)(uVar4 + uVar25);
          uVar15 = 0;
          while (uVar15 != uVar16) {
            uVar15 = uVar15 + 1;
            uVar22 = 0;
            while (uVar26 = uVar22, uVar32 != uVar26) {
              iVar10 = (int)uVar26;
              lVar27 = (long)((int)local_1b0 + iVar10);
              fVar34 = *(float *)((long)memblk + lVar27 * 4);
              fVar33 = fVar34 * fVar43 + 0.5;
              if (fVar33 <= 0.0) {
                fVar33 = 0.0;
              }
              if (fVar43 <= fVar33) {
                fVar33 = fVar43;
              }
              fVar34 = (float)((int)fVar33 & 0xff) / fVar43 - fVar34;
              puVar12[uVar26] = (uint8_t)(int)fVar33;
              uVar22 = uVar26 + 1;
              if ((long)uVar22 < lVar20) {
                *(float *)((long)memblk + lVar27 * 4 + 4) =
                     fVar34 * -7.0 * 0.0625 + *(float *)((long)memblk + lVar27 * 4 + 4);
              }
              if ((long)uVar15 < (long)(int)h_00) {
                if (uVar26 == 0) {
                  lVar27 = (long)(iVar10 + (int)uVar7);
                }
                else {
                  lVar27 = (long)(iVar10 + (int)uVar7);
                  *(float *)((long)memblk + lVar27 * 4 + -4) =
                       fVar34 * -3.0 * 0.0625 + *(float *)((long)memblk + lVar27 * 4 + -4);
                }
                *(float *)((long)memblk + lVar27 * 4) =
                     fVar34 * -5.0 * 0.0625 + *(float *)((long)memblk + lVar27 * 4);
                if ((long)uVar22 < lVar20) {
                  *(float *)((long)memblk + lVar27 * 4 + 4) =
                       fVar34 * -0.0625 + *(float *)((long)memblk + lVar27 * 4 + 4);
                }
              }
            }
            puVar12 = puVar12 + iVar8;
            uVar7 = uVar7 + uVar5;
            local_1b0 = local_1b0 + uVar5;
          }
        }
        else {
          uVar7 = (ulong)((uVar17 + 1) * uVar30 + uVar25);
          local_1b0 = (ulong)(uVar4 + uVar25);
          uVar15 = 0;
          while (uVar15 != uVar16) {
            uVar15 = uVar15 + 1;
            uVar22 = 0;
            while (uVar26 = uVar22, uVar32 != uVar26) {
              iVar10 = (int)uVar26;
              lVar27 = (long)((int)local_1b0 + iVar10);
              fVar34 = *(float *)((long)memblk + lVar27 * 4);
              fVar33 = fVar34 * fVar43 + 0.5;
              if (fVar33 <= 0.0) {
                fVar33 = 0.0;
              }
              if (fVar43 <= fVar33) {
                fVar33 = fVar43;
              }
              fVar34 = (float)((int)fVar33 & 0xffff) / fVar43 - fVar34;
              *(short *)(puVar12 + uVar26 * 2) = (short)(int)fVar33;
              uVar22 = uVar26 + 1;
              if ((long)uVar22 < lVar20) {
                *(float *)((long)memblk + lVar27 * 4 + 4) =
                     fVar34 * -7.0 * 0.0625 + *(float *)((long)memblk + lVar27 * 4 + 4);
              }
              if ((long)uVar15 < (long)(int)h_00) {
                if (uVar26 == 0) {
                  lVar27 = (long)(iVar10 + (int)uVar7);
                }
                else {
                  lVar27 = (long)(iVar10 + (int)uVar7);
                  *(float *)((long)memblk + lVar27 * 4 + -4) =
                       fVar34 * -3.0 * 0.0625 + *(float *)((long)memblk + lVar27 * 4 + -4);
                }
                *(float *)((long)memblk + lVar27 * 4) =
                     fVar34 * -5.0 * 0.0625 + *(float *)((long)memblk + lVar27 * 4);
                if ((long)uVar22 < lVar20) {
                  *(float *)((long)memblk + lVar27 * 4 + 4) =
                       fVar34 * -0.0625 + *(float *)((long)memblk + lVar27 * 4 + 4);
                }
              }
            }
            puVar12 = puVar12 + (long)iVar8 * 2;
            uVar7 = uVar7 + uVar5;
            local_1b0 = local_1b0 + uVar5;
          }
        }
      }
    }
    aom_free(memblk);
    aom_free(b);
    aom_free(b_00);
    aom_free(plane);
    aom_free(block);
    aom_free(memblk_00);
    aom_noise_tx_free(noise_tx);
    aom_flat_block_finder_free(&block_finder_full);
    if (*chroma_sub != 0) {
      aom_flat_block_finder_free(&block_finder_chroma);
      aom_free(memblk_01);
      aom_noise_tx_free(noise_tx_00);
    }
  }
  else {
    fwrite("aom_wiener_denoise_2d doesn\'t handle different chroma subsampling\n",0x42,1,_stderr);
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

int aom_wiener_denoise_2d(const uint8_t *const data[3], uint8_t *denoised[3],
                          int w, int h, int stride[3], int chroma_sub[2],
                          float *noise_psd[3], int block_size, int bit_depth,
                          int use_highbd) {
  float *plane = NULL, *block = NULL, *window_full = NULL,
        *window_chroma = NULL;
  double *block_d = NULL, *plane_d = NULL;
  struct aom_noise_tx_t *tx_full = NULL;
  struct aom_noise_tx_t *tx_chroma = NULL;
  const int num_blocks_w = (w + block_size - 1) / block_size;
  const int num_blocks_h = (h + block_size - 1) / block_size;
  const int result_stride = (num_blocks_w + 2) * block_size;
  const int result_height = (num_blocks_h + 2) * block_size;
  float *result = NULL;
  int init_success = 1;
  aom_flat_block_finder_t block_finder_full;
  aom_flat_block_finder_t block_finder_chroma;
  const float kBlockNormalization = (float)((1 << bit_depth) - 1);
  if (chroma_sub[0] != chroma_sub[1]) {
    fprintf(stderr,
            "aom_wiener_denoise_2d doesn't handle different chroma "
            "subsampling\n");
    return 0;
  }
  init_success &= aom_flat_block_finder_init(&block_finder_full, block_size,
                                             bit_depth, use_highbd);
  result = (float *)aom_malloc((num_blocks_h + 2) * block_size * result_stride *
                               sizeof(*result));
  plane = (float *)aom_malloc(block_size * block_size * sizeof(*plane));
  block =
      (float *)aom_memalign(32, 2 * block_size * block_size * sizeof(*block));
  block_d = (double *)aom_malloc(block_size * block_size * sizeof(*block_d));
  plane_d = (double *)aom_malloc(block_size * block_size * sizeof(*plane_d));
  window_full = get_half_cos_window(block_size);
  tx_full = aom_noise_tx_malloc(block_size);

  if (chroma_sub[0] != 0) {
    init_success &= aom_flat_block_finder_init(&block_finder_chroma,
                                               block_size >> chroma_sub[0],
                                               bit_depth, use_highbd);
    window_chroma = get_half_cos_window(block_size >> chroma_sub[0]);
    tx_chroma = aom_noise_tx_malloc(block_size >> chroma_sub[0]);
  } else {
    window_chroma = window_full;
    tx_chroma = tx_full;
  }

  init_success &= (tx_full != NULL) && (tx_chroma != NULL) && (plane != NULL) &&
                  (plane_d != NULL) && (block != NULL) && (block_d != NULL) &&
                  (window_full != NULL) && (window_chroma != NULL) &&
                  (result != NULL);
  for (int c = init_success ? 0 : 3; c < 3; ++c) {
    float *window_function = c == 0 ? window_full : window_chroma;
    aom_flat_block_finder_t *block_finder = &block_finder_full;
    const int chroma_sub_h = c > 0 ? chroma_sub[1] : 0;
    const int chroma_sub_w = c > 0 ? chroma_sub[0] : 0;
    struct aom_noise_tx_t *tx =
        (c > 0 && chroma_sub[0] > 0) ? tx_chroma : tx_full;
    if (!data[c] || !denoised[c]) continue;
    if (c > 0 && chroma_sub[0] != 0) {
      block_finder = &block_finder_chroma;
    }
    memset(result, 0, sizeof(*result) * result_stride * result_height);
    // Do overlapped block processing (half overlapped). The block rows can
    // easily be done in parallel
    for (int offsy = 0; offsy < (block_size >> chroma_sub_h);
         offsy += (block_size >> chroma_sub_h) / 2) {
      for (int offsx = 0; offsx < (block_size >> chroma_sub_w);
           offsx += (block_size >> chroma_sub_w) / 2) {
        // Pad the boundary when processing each block-set.
        for (int by = -1; by < num_blocks_h; ++by) {
          for (int bx = -1; bx < num_blocks_w; ++bx) {
            const int pixels_per_block =
                (block_size >> chroma_sub_w) * (block_size >> chroma_sub_h);
            aom_flat_block_finder_extract_block(
                block_finder, data[c], w >> chroma_sub_w, h >> chroma_sub_h,
                stride[c], bx * (block_size >> chroma_sub_w) + offsx,
                by * (block_size >> chroma_sub_h) + offsy, plane_d, block_d);
            for (int j = 0; j < pixels_per_block; ++j) {
              block[j] = (float)block_d[j];
              plane[j] = (float)plane_d[j];
            }
            pointwise_multiply(window_function, block, pixels_per_block);
            aom_noise_tx_forward(tx, block);
            aom_noise_tx_filter(tx, noise_psd[c]);
            aom_noise_tx_inverse(tx, block);

            // Apply window function to the plane approximation (we will apply
            // it to the sum of plane + block when composing the results).
            pointwise_multiply(window_function, plane, pixels_per_block);

            for (int y = 0; y < (block_size >> chroma_sub_h); ++y) {
              const int y_result =
                  y + (by + 1) * (block_size >> chroma_sub_h) + offsy;
              for (int x = 0; x < (block_size >> chroma_sub_w); ++x) {
                const int x_result =
                    x + (bx + 1) * (block_size >> chroma_sub_w) + offsx;
                result[y_result * result_stride + x_result] +=
                    (block[y * (block_size >> chroma_sub_w) + x] +
                     plane[y * (block_size >> chroma_sub_w) + x]) *
                    window_function[y * (block_size >> chroma_sub_w) + x];
              }
            }
          }
        }
      }
    }
    if (use_highbd) {
      dither_and_quantize_highbd(result, result_stride, (uint16_t *)denoised[c],
                                 w, h, stride[c], chroma_sub_w, chroma_sub_h,
                                 block_size, kBlockNormalization);
    } else {
      dither_and_quantize_lowbd(result, result_stride, denoised[c], w, h,
                                stride[c], chroma_sub_w, chroma_sub_h,
                                block_size, kBlockNormalization);
    }
  }
  aom_free(result);
  aom_free(plane);
  aom_free(block);
  aom_free(plane_d);
  aom_free(block_d);
  aom_free(window_full);

  aom_noise_tx_free(tx_full);

  aom_flat_block_finder_free(&block_finder_full);
  if (chroma_sub[0] != 0) {
    aom_flat_block_finder_free(&block_finder_chroma);
    aom_free(window_chroma);
    aom_noise_tx_free(tx_chroma);
  }
  return init_success;
}